

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int simple_next_token(uint8_t **pp,BOOL no_line_terminator)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint c;
  
  pbVar5 = *pp;
LAB_00129853:
  do {
    pbVar4 = pbVar5;
    pbVar5 = pbVar4 + 1;
    bVar3 = *pbVar4;
    c = (uint)bVar3;
    if (bVar3 < 0xd) {
      if ((1 < bVar3 - 0xb) && (c != 9)) {
        if (c != 10) goto LAB_00129948;
LAB_00129894:
        if (no_line_terminator != 0) {
          return 10;
        }
      }
      goto LAB_00129853;
    }
    if (bVar3 < 0x2f) {
      if (c == 0xd) goto LAB_00129894;
      if (c != 0x20) {
LAB_00129948:
        if ((char)bVar3 < '\0') {
          uVar1 = lre_is_id_start(c);
        }
        else {
          uVar1 = (uint)((lre_id_start_table_ascii[bVar3 >> 5] >> (c & 0x1f) & 1) != 0);
        }
        if (uVar1 == 0) {
          return c;
        }
        if (c == 0x68 || bVar3 < 0x68) {
          if (c == 0x65) {
            if (((*pbVar5 == 0x78) && (pbVar4[2] == 0x70)) &&
               ((pbVar4[3] == 0x6f &&
                (((pbVar4[4] == 0x72 && (pbVar4[5] == 0x74)) &&
                 (iVar2 = lre_js_is_ident_next((uint)pbVar4[6]), iVar2 == 0)))))) {
              *pp = pbVar4 + 6;
              return -0x35;
            }
          }
          else if (((c == 0x66) && (*pbVar5 == 0x75)) &&
                  ((((pbVar4[2] == 0x6e && ((pbVar4[3] == 99 && (pbVar4[4] == 0x74)))) &&
                    (pbVar4[5] == 0x69)) &&
                   (((pbVar4[6] == 0x6f && (pbVar4[7] == 0x6e)) &&
                    (iVar2 = lre_js_is_ident_next((uint)pbVar4[8]), iVar2 == 0)))))) {
            return -0x3b;
          }
        }
        else if (c == 0x6f) {
          if ((*pbVar5 == 0x66) && (iVar2 = lre_js_is_ident_next((uint)pbVar4[2]), iVar2 == 0)) {
            return -0x27;
          }
        }
        else if (c == 0x69) {
          bVar3 = *pbVar5;
          if (bVar3 == 0x6e) {
            iVar2 = lre_js_is_ident_next((uint)pbVar4[2]);
            if (iVar2 == 0) {
              return -0x49;
            }
            bVar3 = *pbVar5;
          }
          if ((((bVar3 == 0x6d) && (pbVar4[2] == 0x70)) && (pbVar4[3] == 0x6f)) &&
             (((pbVar4[4] == 0x72 && (pbVar4[5] == 0x74)) &&
              (iVar2 = lre_js_is_ident_next((uint)pbVar4[6]), iVar2 == 0)))) {
            *pp = pbVar4 + 6;
            return -0x33;
          }
        }
        return -0x7d;
      }
    }
    else {
      if (c != 0x2f) {
        if (c == 0x3d) {
          if (*pbVar5 == 0x3e) {
            return -0x5c;
          }
          return 0x3d;
        }
        goto LAB_00129948;
      }
      if (*pbVar5 != 0x2f) {
        if (*pbVar5 != 0x2a) {
          return 0x2f;
        }
        pbVar5 = pbVar4 + 2;
        do {
          bVar3 = *pbVar5;
          if (bVar3 == 0xd) {
            if (no_line_terminator != 0) {
              return 10;
            }
          }
          else {
            if (bVar3 == 0) goto LAB_00129853;
            if ((no_line_terminator != 0) && (bVar3 == 10)) {
              return 10;
            }
            if ((bVar3 == 0x2a) && (pbVar5[1] == 0x2f)) goto LAB_0012990e;
          }
          pbVar5 = pbVar5 + 1;
        } while( true );
      }
      if (no_line_terminator != 0) {
        return 10;
      }
      bVar3 = 0x2f;
      while ((0xd < bVar3 || ((0x2401U >> (bVar3 & 0x1f) & 1) == 0))) {
        bVar3 = pbVar5[1];
        pbVar5 = pbVar5 + 1;
      }
    }
  } while( true );
LAB_0012990e:
  pbVar5 = pbVar5 + 2;
  goto LAB_00129853;
}

Assistant:

static int simple_next_token(const uint8_t **pp, BOOL no_line_terminator)
{
    const uint8_t *p;
    uint32_t c;
    
    /* skip spaces and comments */
    p = *pp;
    for (;;) {
        switch(c = *p++) {
        case '\r':
        case '\n':
            if (no_line_terminator)
                return '\n';
            continue;
        case ' ':
        case '\t':
        case '\v':
        case '\f':
            continue;
        case '/':
            if (*p == '/') {
                if (no_line_terminator)
                    return '\n';
                while (*p && *p != '\r' && *p != '\n')
                    p++;
                continue;
            }
            if (*p == '*') {
                while (*++p) {
                    if ((*p == '\r' || *p == '\n') && no_line_terminator)
                        return '\n';
                    if (*p == '*' && p[1] == '/') {
                        p += 2;
                        break;
                    }
                }
                continue;
            }
            break;
        case '=':
            if (*p == '>')
                return TOK_ARROW;
            break;
        default:
            if (lre_js_is_ident_first(c)) {
                if (c == 'i') {
                    if (p[0] == 'n' && !lre_js_is_ident_next(p[1])) {
                        return TOK_IN;
                    }
                    if (p[0] == 'm' && p[1] == 'p' && p[2] == 'o' &&
                        p[3] == 'r' && p[4] == 't' &&
                        !lre_js_is_ident_next(p[5])) {
                        *pp = p + 5;
                        return TOK_IMPORT;
                    }
                } else if (c == 'o' && *p == 'f' && !lre_js_is_ident_next(p[1])) {
                    return TOK_OF;
                } else if (c == 'e' &&
                           p[0] == 'x' && p[1] == 'p' && p[2] == 'o' &&
                           p[3] == 'r' && p[4] == 't' &&
                           !lre_js_is_ident_next(p[5])) {
                    *pp = p + 5;
                    return TOK_EXPORT;
                } else if (c == 'f' && p[0] == 'u' && p[1] == 'n' &&
                         p[2] == 'c' && p[3] == 't' && p[4] == 'i' &&
                         p[5] == 'o' && p[6] == 'n' && !lre_js_is_ident_next(p[7])) {
                    return TOK_FUNCTION;
                }
                return TOK_IDENT;
            }
            break;
        }
        return c;
    }
}